

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

char * deqp::gles31::Functional::anon_unknown_1::FeedbackPrimitiveTypeCase::
       getTessellationOutputDescription
                 (TessellationOutputType tessellationOutput,TessellationPointMode pointMode)

{
  char *pcVar1;
  char *pcVar2;
  
  if (tessellationOutput == TESSELLATION_OUT_ISOLINES) {
    pcVar2 = "isolines";
    pcVar1 = "points (isolines in point mode)";
  }
  else if (tessellationOutput == TESSELLATION_OUT_QUADS) {
    pcVar2 = "quads";
    pcVar1 = "points (quads in point mode)";
  }
  else {
    if (tessellationOutput != TESSELLATION_OUT_TRIANGLES) {
      return (char *)0x0;
    }
    pcVar2 = "triangles";
    pcVar1 = "points (triangles in point mode)";
  }
  if (pointMode == TESSELLATION_POINTMODE_OFF) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const char* FeedbackPrimitiveTypeCase::getTessellationOutputDescription (TessellationOutputType tessellationOutput, TessellationPointMode pointMode)
{
	switch (tessellationOutput)
	{
		case TESSELLATION_OUT_TRIANGLES:	return (pointMode) ? ("points (triangles in point mode)") : ("triangles");
		case TESSELLATION_OUT_QUADS:		return (pointMode) ? ("points (quads in point mode)")     : ("quads");
		case TESSELLATION_OUT_ISOLINES:		return (pointMode) ? ("points (isolines in point mode)")  : ("isolines");
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}